

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_commodities.cpp
# Opt level: O2

void __thiscall commodities_unusual2string_Test::TestBody(commodities_unusual2string_Test *this)

{
  uint32_t uVar1;
  precise_unit *ppVar2;
  ulong extraout_RAX;
  precise_unit *un;
  __uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
  extraout_RAX_00;
  uint64_t uVar3;
  char *pcVar4;
  double __x;
  double dVar5;
  double __x_00;
  double in_XMM1_Qa;
  precise_unit pVar6;
  precise_unit local_190;
  AssertionResult gtest_ar;
  precise_unit cominv;
  precise_unit local_148;
  precise_unit com2;
  AssertHelper local_128;
  string str;
  precise_unit com;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  string local_30;
  
  pVar6 = units::precise_unit::inv((precise_unit *)units::precise::kg);
  std::__cxx11::string::string((string *)&local_30,"happy\'u",(allocator *)&str);
  uVar1 = units::getCommodity(&local_30);
  uVar3 = pVar6._8_8_ >> 0x20;
  com.commodity_ = uVar1 | pVar6.commodity_;
  com.base_units_ = pVar6.base_units_;
  com.multiplier_ = pVar6.multiplier_;
  std::__cxx11::string::~string((string *)&local_30);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&str,(units *)&com,ppVar2,uVar3);
  std::__cxx11::string::string((string *)&local_50,(string *)&str);
  uVar3 = units::getDefaultFlags();
  com2 = units::unit_from_string(&local_50,uVar3);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)&gtest_ar,"unit_from_string(str)","com",&com2,&com);
  std::__cxx11::string::~string((string *)&local_50);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&com2);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&cominv,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_commodities.cpp"
               ,0xa3,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&cominv,(Message *)&com2);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&cominv);
    if (com2.multiplier_ != 0.0) {
      (**(code **)(*(long *)com2.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  dVar5 = units::precise_unit::pow((precise_unit *)units::precise::kg,__x,in_XMM1_Qa);
  std::__cxx11::string::string((string *)&local_70,"happy\'u",(allocator *)&gtest_ar);
  uVar1 = units::getCommodity(&local_70);
  uVar3 = extraout_RAX >> 0x20;
  com2.base_units_ = SUB84(extraout_RAX,0);
  com2.multiplier_ = dVar5 * 12.0;
  com2.commodity_ = uVar1 | (uint)(extraout_RAX >> 0x20);
  std::__cxx11::string::~string((string *)&local_70);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_((string *)&gtest_ar,(units *)&com2,ppVar2,uVar3);
  std::__cxx11::string::operator=((string *)&str,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string((string *)&local_90,(string *)&str);
  uVar3 = units::getDefaultFlags();
  cominv = units::unit_from_string(&local_90,uVar3);
  ppVar2 = &cominv;
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)&gtest_ar,"unit_from_string(str)","com2",ppVar2,&com2);
  std::__cxx11::string::~string((string *)&local_90);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&cominv);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    ppVar2 = (precise_unit *)0xa7;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_190,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_commodities.cpp"
               ,0xa7,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_190,(Message *)&cominv);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_190);
    if (cominv.multiplier_ != 0.0) {
      (**(code **)(*(long *)cominv.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  cominv = units::precise_unit::inv(&com);
  un = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_((string *)&gtest_ar,(units *)&cominv,un,(uint64_t)ppVar2);
  std::__cxx11::string::operator=((string *)&str,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string((string *)&local_b0,(string *)&str);
  uVar3 = units::getDefaultFlags();
  local_190 = units::unit_from_string(&local_b0,uVar3);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)&gtest_ar,"unit_from_string(str)","cominv",&local_190,&cominv);
  std::__cxx11::string::~string((string *)&local_b0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_190);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_148,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_commodities.cpp"
               ,0xab,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_148,(Message *)&local_190);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_148);
    if ((long *)local_190.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_190.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  gtest_ar._0_8_ = units::precise_unit::pow((precise_unit *)units::precise::m,__x_00,in_XMM1_Qa);
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )extraout_RAX_00.
           super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           .
           super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
           ._M_head_impl;
  pVar6 = units::precise_unit::operator*
                    ((precise_unit *)&gtest_ar,(precise_unit *)units::precise::kg);
  std::__cxx11::string::string((string *)&local_d0,"happy\'u",(allocator *)&local_148);
  uVar1 = units::getCommodity(&local_d0);
  uVar3 = pVar6._8_8_ >> 0x20;
  local_190.base_units_ = pVar6.base_units_;
  local_190.multiplier_ = pVar6.multiplier_ * 12.0;
  local_190.commodity_ = uVar1 | pVar6.commodity_;
  std::__cxx11::string::~string((string *)&local_d0);
  local_190 = units::precise_unit::inv(&local_190);
  ppVar2 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_((string *)&gtest_ar,(units *)&local_190,ppVar2,uVar3);
  std::__cxx11::string::operator=((string *)&str,(string *)&gtest_ar);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__cxx11::string::string((string *)&local_f0,(string *)&str);
  uVar3 = units::getDefaultFlags();
  local_148 = units::unit_from_string(&local_f0,uVar3);
  testing::internal::CmpHelperEQ<units::precise_unit,units::precise_unit>
            ((internal *)&gtest_ar,"unit_from_string(str)","com2inv",&local_148,&local_190);
  std::__cxx11::string::~string((string *)&local_f0);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_148);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = *(char **)gtest_ar.message_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_commodities.cpp"
               ,0xb1,pcVar4);
    testing::internal::AssertHelper::operator=(&local_128,(Message *)&local_148);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    if ((long *)local_148.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_148.multiplier_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

TEST(commodities, unusual2string)
{
    precise_unit com(1.0, precise::kg.inv(), getCommodity("happy'u"));
    auto str = to_string(com);
    EXPECT_EQ(unit_from_string(str), com);

    precise_unit com2(12.0, precise::kg.pow(-2), getCommodity("happy'u"));
    str = to_string(com2);
    EXPECT_EQ(unit_from_string(str), com2);

    precise_unit cominv = com.inv();
    str = to_string(cominv);
    EXPECT_EQ(unit_from_string(str), cominv);

    precise_unit com2inv(
        12.0, precise::m.pow(-2) * precise::kg, getCommodity("happy'u"));
    com2inv = com2inv.inv();
    str = to_string(com2inv);
    EXPECT_EQ(unit_from_string(str), com2inv);
}